

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realloc_unittest.cc
# Opt level: O3

void __thiscall ReallocUnittest_Basics_Test::TestBody(ReallocUnittest_Basics_Test *this)

{
  undefined1 __ptr [8];
  void *pvVar1;
  char *__ptr_00;
  char cVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  size_t __size;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  int i;
  long lVar7;
  int i_1;
  uint uVar8;
  uint uVar9;
  size_t __size_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar25;
  undefined1 auVar22 [16];
  int iVar26;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar59;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar60;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar61;
  int iVar76;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  AssertHelper local_50;
  Message local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  __size_00 = 0;
  do {
    uVar8 = (uint)__size_00;
    lVar7 = __size_00 - 1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    __size = 0;
    do {
      pvVar1 = malloc(__size_00);
      auVar83 = _DAT_00137090;
      auVar84._8_4_ = 0xffffffff;
      auVar84._0_8_ = 0xffffffffffffffff;
      auVar84._12_4_ = 0xffffffff;
      if (__size_00 != 0) {
        uVar3 = 0;
        auVar37 = _DAT_00137080;
        auVar46 = _DAT_00137070;
        auVar67 = _DAT_00137060;
        auVar49 = _DAT_00137050;
        auVar69 = _DAT_00137040;
        auVar16 = _DAT_00137030;
        auVar18 = _DAT_00137020;
        auVar20 = _DAT_00137010;
        do {
          auVar22 = auVar10 ^ auVar83;
          auVar27 = auVar37 ^ auVar83;
          iVar59 = auVar22._0_4_;
          iVar61 = -(uint)(iVar59 < auVar27._0_4_);
          iVar60 = auVar22._4_4_;
          auVar28._4_4_ = -(uint)(iVar60 < auVar27._4_4_);
          iVar25 = auVar22._8_4_;
          iVar76 = -(uint)(iVar25 < auVar27._8_4_);
          iVar26 = auVar22._12_4_;
          auVar28._12_4_ = -(uint)(iVar26 < auVar27._12_4_);
          auVar40._4_4_ = iVar61;
          auVar40._0_4_ = iVar61;
          auVar40._8_4_ = iVar76;
          auVar40._12_4_ = iVar76;
          auVar77 = pshuflw(in_XMM12,auVar40,0xe8);
          auVar22._4_4_ = -(uint)(auVar27._4_4_ == iVar60);
          auVar22._12_4_ = -(uint)(auVar27._12_4_ == iVar26);
          auVar22._0_4_ = auVar22._4_4_;
          auVar22._8_4_ = auVar22._12_4_;
          auVar82 = pshuflw(in_XMM13,auVar22,0xe8);
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar27 = pshuflw(auVar77,auVar28,0xe8);
          auVar27 = (auVar27 | auVar82 & auVar77) ^ auVar84;
          auVar27 = packssdw(auVar27,auVar27);
          cVar2 = (char)uVar3;
          if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar1 + uVar3) = cVar2;
          }
          auVar28 = auVar22 & auVar40 | auVar28;
          auVar22 = packssdw(auVar28,auVar28);
          auVar22 = packssdw(auVar22 ^ auVar84,auVar22 ^ auVar84);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22._0_4_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar1 + uVar3 + 1) = cVar2 + '\x01';
          }
          auVar22 = auVar46 ^ auVar83;
          iVar61 = -(uint)(iVar59 < auVar22._0_4_);
          auVar62._4_4_ = -(uint)(iVar60 < auVar22._4_4_);
          iVar76 = -(uint)(iVar25 < auVar22._8_4_);
          auVar62._12_4_ = -(uint)(iVar26 < auVar22._12_4_);
          auVar27._4_4_ = iVar61;
          auVar27._0_4_ = iVar61;
          auVar27._8_4_ = iVar76;
          auVar27._12_4_ = iVar76;
          auVar39._4_4_ = -(uint)(auVar22._4_4_ == iVar60);
          auVar39._12_4_ = -(uint)(auVar22._12_4_ == iVar26);
          auVar39._0_4_ = auVar39._4_4_;
          auVar39._8_4_ = auVar39._12_4_;
          auVar62._0_4_ = auVar62._4_4_;
          auVar62._8_4_ = auVar62._12_4_;
          auVar22 = auVar39 & auVar27 | auVar62;
          auVar22 = packssdw(auVar22,auVar22);
          auVar22 = packssdw(auVar22 ^ auVar84,auVar22 ^ auVar84);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
            *(char *)((long)pvVar1 + uVar3 + 2) = cVar2 + '\x02';
          }
          auVar27 = pshufhw(auVar27,auVar27,0x84);
          auVar40 = pshufhw(auVar39,auVar39,0x84);
          auVar28 = pshufhw(auVar27,auVar62,0x84);
          auVar27 = (auVar28 | auVar40 & auVar27) ^ auVar84;
          auVar27 = packssdw(auVar27,auVar27);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27._0_4_ >> 0x18 & 1) != 0) {
            *(char *)((long)pvVar1 + uVar3 + 3) = cVar2 + '\x03';
          }
          auVar27 = auVar67 ^ auVar83;
          iVar61 = -(uint)(iVar59 < auVar27._0_4_);
          auVar30._4_4_ = -(uint)(iVar60 < auVar27._4_4_);
          iVar76 = -(uint)(iVar25 < auVar27._8_4_);
          auVar30._12_4_ = -(uint)(iVar26 < auVar27._12_4_);
          auVar41._4_4_ = iVar61;
          auVar41._0_4_ = iVar61;
          auVar41._8_4_ = iVar76;
          auVar41._12_4_ = iVar76;
          auVar22 = pshuflw(auVar22,auVar41,0xe8);
          auVar29._4_4_ = -(uint)(auVar27._4_4_ == iVar60);
          auVar29._12_4_ = -(uint)(auVar27._12_4_ == iVar26);
          auVar29._0_4_ = auVar29._4_4_;
          auVar29._8_4_ = auVar29._12_4_;
          auVar28 = pshuflw(auVar82 & auVar77,auVar29,0xe8);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar27 = pshuflw(auVar22,auVar30,0xe8);
          auVar27 = (auVar27 | auVar28 & auVar22) ^ auVar84;
          auVar27 = packssdw(auVar27,auVar27);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar1 + uVar3 + 4) = cVar2 + '\x04';
          }
          auVar30 = auVar29 & auVar41 | auVar30;
          auVar27 = packssdw(auVar30,auVar30);
          auVar27 = packssdw(auVar27 ^ auVar84,auVar27 ^ auVar84);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27._4_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar1 + uVar3 + 5) = cVar2 + '\x05';
          }
          auVar27 = auVar49 ^ auVar83;
          iVar61 = -(uint)(iVar59 < auVar27._0_4_);
          auVar63._4_4_ = -(uint)(iVar60 < auVar27._4_4_);
          iVar76 = -(uint)(iVar25 < auVar27._8_4_);
          auVar63._12_4_ = -(uint)(iVar26 < auVar27._12_4_);
          auVar77._4_4_ = iVar61;
          auVar77._0_4_ = iVar61;
          auVar77._8_4_ = iVar76;
          auVar77._12_4_ = iVar76;
          auVar82._4_4_ = -(uint)(auVar27._4_4_ == iVar60);
          auVar82._12_4_ = -(uint)(auVar27._12_4_ == iVar26);
          auVar82._0_4_ = auVar82._4_4_;
          auVar82._8_4_ = auVar82._12_4_;
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar27 = auVar82 & auVar77 | auVar63;
          auVar27 = packssdw(auVar27,auVar27);
          auVar27 = packssdw(auVar27 ^ auVar84,auVar27 ^ auVar84);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar1 + uVar3 + 6) = cVar2 + '\x06';
          }
          auVar40 = pshufhw(auVar77,auVar77,0x84);
          auVar82 = pshufhw(auVar82,auVar82,0x84);
          auVar77 = pshufhw(auVar40,auVar63,0x84);
          auVar40 = (auVar77 | auVar82 & auVar40) ^ auVar84;
          auVar40 = packssdw(auVar40,auVar40);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._6_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar1 + uVar3 + 7) = cVar2 + '\a';
          }
          auVar40 = auVar69 ^ auVar83;
          iVar61 = -(uint)(iVar59 < auVar40._0_4_);
          auVar32._4_4_ = -(uint)(iVar60 < auVar40._4_4_);
          iVar76 = -(uint)(iVar25 < auVar40._8_4_);
          auVar32._12_4_ = -(uint)(iVar26 < auVar40._12_4_);
          auVar42._4_4_ = iVar61;
          auVar42._0_4_ = iVar61;
          auVar42._8_4_ = iVar76;
          auVar42._12_4_ = iVar76;
          auVar27 = pshuflw(auVar27,auVar42,0xe8);
          auVar31._4_4_ = -(uint)(auVar40._4_4_ == iVar60);
          auVar31._12_4_ = -(uint)(auVar40._12_4_ == iVar26);
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar28 = pshuflw(auVar28 & auVar22,auVar31,0xe8);
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar22 = pshuflw(auVar27,auVar32,0xe8);
          auVar22 = (auVar22 | auVar28 & auVar27) ^ auVar84;
          auVar22 = packssdw(auVar22,auVar22);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar1 + uVar3 + 8) = cVar2 + '\b';
          }
          auVar32 = auVar31 & auVar42 | auVar32;
          auVar22 = packssdw(auVar32,auVar32);
          auVar22 = packssdw(auVar22 ^ auVar84,auVar22 ^ auVar84);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22._8_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar1 + uVar3 + 9) = cVar2 + '\t';
          }
          auVar22 = auVar16 ^ auVar83;
          iVar61 = -(uint)(iVar59 < auVar22._0_4_);
          auVar64._4_4_ = -(uint)(iVar60 < auVar22._4_4_);
          iVar76 = -(uint)(iVar25 < auVar22._8_4_);
          auVar64._12_4_ = -(uint)(iVar26 < auVar22._12_4_);
          auVar33._4_4_ = iVar61;
          auVar33._0_4_ = iVar61;
          auVar33._8_4_ = iVar76;
          auVar33._12_4_ = iVar76;
          auVar43._4_4_ = -(uint)(auVar22._4_4_ == iVar60);
          auVar43._12_4_ = -(uint)(auVar22._12_4_ == iVar26);
          auVar43._0_4_ = auVar43._4_4_;
          auVar43._8_4_ = auVar43._12_4_;
          auVar64._0_4_ = auVar64._4_4_;
          auVar64._8_4_ = auVar64._12_4_;
          auVar22 = auVar43 & auVar33 | auVar64;
          auVar22 = packssdw(auVar22,auVar22);
          auVar22 = packssdw(auVar22 ^ auVar84,auVar22 ^ auVar84);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar1 + uVar3 + 10) = cVar2 + '\n';
          }
          auVar40 = pshufhw(auVar33,auVar33,0x84);
          auVar82 = pshufhw(auVar43,auVar43,0x84);
          auVar77 = pshufhw(auVar40,auVar64,0x84);
          auVar40 = (auVar77 | auVar82 & auVar40) ^ auVar84;
          auVar40 = packssdw(auVar40,auVar40);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._10_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar1 + uVar3 + 0xb) = cVar2 + '\v';
          }
          auVar40 = auVar18 ^ auVar83;
          iVar61 = -(uint)(iVar59 < auVar40._0_4_);
          auVar35._4_4_ = -(uint)(iVar60 < auVar40._4_4_);
          iVar76 = -(uint)(iVar25 < auVar40._8_4_);
          auVar35._12_4_ = -(uint)(iVar26 < auVar40._12_4_);
          auVar44._4_4_ = iVar61;
          auVar44._0_4_ = iVar61;
          auVar44._8_4_ = iVar76;
          auVar44._12_4_ = iVar76;
          auVar22 = pshuflw(auVar22,auVar44,0xe8);
          auVar34._4_4_ = -(uint)(auVar40._4_4_ == iVar60);
          auVar34._12_4_ = -(uint)(auVar40._12_4_ == iVar26);
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          in_XMM13 = pshuflw(auVar28 & auVar27,auVar34,0xe8);
          in_XMM13 = in_XMM13 & auVar22;
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar22 = pshuflw(auVar22,auVar35,0xe8);
          auVar22 = (auVar22 | in_XMM13) ^ auVar84;
          auVar22 = packssdw(auVar22,auVar22);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar1 + uVar3 + 0xc) = cVar2 + '\f';
          }
          auVar35 = auVar34 & auVar44 | auVar35;
          auVar22 = packssdw(auVar35,auVar35);
          auVar22 = packssdw(auVar22 ^ auVar84,auVar22 ^ auVar84);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22._12_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar1 + uVar3 + 0xd) = cVar2 + '\r';
          }
          auVar22 = auVar20 ^ auVar83;
          auVar65._0_4_ = -(uint)(iVar59 < auVar22._0_4_);
          auVar65._4_4_ = -(uint)(iVar60 < auVar22._4_4_);
          auVar65._8_4_ = -(uint)(iVar25 < auVar22._8_4_);
          auVar65._12_4_ = -(uint)(iVar26 < auVar22._12_4_);
          auVar36._4_4_ = auVar65._0_4_;
          auVar36._0_4_ = auVar65._0_4_;
          auVar36._8_4_ = auVar65._8_4_;
          auVar36._12_4_ = auVar65._8_4_;
          iVar59 = -(uint)(auVar22._4_4_ == iVar60);
          iVar60 = -(uint)(auVar22._12_4_ == iVar26);
          auVar23._4_4_ = iVar59;
          auVar23._0_4_ = iVar59;
          auVar23._8_4_ = iVar60;
          auVar23._12_4_ = iVar60;
          auVar45._4_4_ = auVar65._4_4_;
          auVar45._0_4_ = auVar65._4_4_;
          auVar45._8_4_ = auVar65._12_4_;
          auVar45._12_4_ = auVar65._12_4_;
          in_XMM12 = auVar23 & auVar36 | auVar45;
          auVar22 = packssdw(auVar65,in_XMM12);
          auVar22 = packssdw(auVar22 ^ auVar84,auVar22 ^ auVar84);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar1 + uVar3 + 0xe) = cVar2 + '\x0e';
          }
          auVar27 = pshufhw(auVar36,auVar36,0x84);
          auVar22 = pshufhw(auVar23,auVar23,0x84);
          auVar28 = pshufhw(auVar27,auVar45,0x84);
          auVar22 = packssdw(auVar22 & auVar27,(auVar28 | auVar22 & auVar27) ^ auVar84);
          auVar22 = packsswb(auVar22,auVar22);
          if ((auVar22._14_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar1 + uVar3 + 0xf) = cVar2 + '\x0f';
          }
          uVar3 = uVar3 + 0x10;
          lVar7 = auVar37._8_8_;
          auVar37._0_8_ = auVar37._0_8_ + 0x10;
          auVar37._8_8_ = lVar7 + 0x10;
          lVar7 = auVar46._8_8_;
          auVar46._0_8_ = auVar46._0_8_ + 0x10;
          auVar46._8_8_ = lVar7 + 0x10;
          lVar7 = auVar67._8_8_;
          auVar67._0_8_ = auVar67._0_8_ + 0x10;
          auVar67._8_8_ = lVar7 + 0x10;
          lVar7 = auVar49._8_8_;
          auVar49._0_8_ = auVar49._0_8_ + 0x10;
          auVar49._8_8_ = lVar7 + 0x10;
          lVar7 = auVar69._8_8_;
          auVar69._0_8_ = auVar69._0_8_ + 0x10;
          auVar69._8_8_ = lVar7 + 0x10;
          lVar7 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 0x10;
          auVar16._8_8_ = lVar7 + 0x10;
          lVar7 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 0x10;
          auVar18._8_8_ = lVar7 + 0x10;
          lVar7 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 0x10;
          auVar20._8_8_ = lVar7 + 0x10;
        } while ((uVar8 + 0xf & 0xfffffff0) != uVar3);
      }
      __ptr_00 = (char *)realloc(pvVar1,__size);
      auVar84 = _DAT_00137090;
      uVar9 = (uint)__size;
      sVar4 = __size_00;
      if ((int)uVar9 < (int)uVar8) {
        sVar4 = __size;
      }
      if ((int)sVar4 != 0) {
        if (*__ptr_00 == '\0') {
          uVar3 = 1;
          do {
            uVar5 = uVar3;
            if (sVar4 == uVar5) break;
            uVar3 = uVar5 + 1;
          } while ((char)((char)(uVar5 + 1) + -1) == __ptr_00[uVar5]);
          local_48.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ =
               CONCAT31(local_48.ss_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._1_3_,sVar4 <= uVar5);
          local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (sVar4 <= uVar5) goto LAB_00108c56;
        }
        else {
          local_48.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ =
               (uint)local_48.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._1_3_ << 8;
        }
        local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_70,(internal *)&local_48,
                   (AssertionResult *)"Valid(dst, std::min(src_size, dst_size))","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/realloc_unittest.cc"
                   ,0x60,(char *)local_70);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
LAB_001094d9:
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_70 != (undefined1  [8])&local_60) {
          operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
        }
        if (local_38._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
        if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          return;
        }
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40;
        local_68 = local_40;
        goto LAB_00109513;
      }
LAB_00108c56:
      if (__size != 0) {
        lVar7 = __size - 1;
        auVar11._8_4_ = (int)lVar7;
        auVar11._0_8_ = lVar7;
        auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar3 = 0;
        auVar12 = _DAT_00137080;
        auVar13 = _DAT_00137070;
        auVar14 = _DAT_00137060;
        auVar15 = _DAT_00137050;
        auVar17 = _DAT_00137040;
        auVar19 = _DAT_00137030;
        auVar21 = _DAT_00137020;
        auVar24 = _DAT_00137010;
        do {
          auVar37 = auVar11 ^ auVar84;
          auVar46 = auVar12 ^ auVar84;
          iVar59 = auVar37._0_4_;
          iVar61 = -(uint)(iVar59 < auVar46._0_4_);
          iVar60 = auVar37._4_4_;
          auVar48._4_4_ = -(uint)(iVar60 < auVar46._4_4_);
          iVar25 = auVar37._8_4_;
          iVar76 = -(uint)(iVar25 < auVar46._8_4_);
          iVar26 = auVar37._12_4_;
          auVar48._12_4_ = -(uint)(iVar26 < auVar46._12_4_);
          auVar66._4_4_ = iVar61;
          auVar66._0_4_ = iVar61;
          auVar66._8_4_ = iVar76;
          auVar66._12_4_ = iVar76;
          auVar37 = pshuflw(in_XMM13,auVar66,0xe8);
          auVar47._4_4_ = -(uint)(auVar46._4_4_ == iVar60);
          auVar47._12_4_ = -(uint)(auVar46._12_4_ == iVar26);
          auVar47._0_4_ = auVar47._4_4_;
          auVar47._8_4_ = auVar47._12_4_;
          auVar46 = pshuflw(auVar83,auVar47,0xe8);
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar83 = pshuflw(auVar37,auVar48,0xe8);
          auVar83 = (auVar83 | auVar46 & auVar37) ^ _DAT_001370b0;
          auVar83 = packssdw(auVar83,auVar83);
          cVar2 = (char)uVar3;
          if ((auVar83 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            __ptr_00[uVar3] = cVar2;
          }
          auVar48 = auVar47 & auVar66 | auVar48;
          auVar83 = packssdw(auVar48,auVar48);
          auVar83 = packssdw(auVar83 ^ _DAT_001370b0,auVar83 ^ _DAT_001370b0);
          auVar83 = packsswb(auVar83,auVar83);
          if ((auVar83._0_4_ >> 8 & 1) != 0) {
            __ptr_00[uVar3 + 1] = cVar2 + '\x01';
          }
          auVar67 = auVar13 ^ auVar84;
          iVar61 = -(uint)(iVar59 < auVar67._0_4_);
          auVar78._4_4_ = -(uint)(iVar60 < auVar67._4_4_);
          iVar76 = -(uint)(iVar25 < auVar67._8_4_);
          auVar78._12_4_ = -(uint)(iVar26 < auVar67._12_4_);
          auVar83._4_4_ = iVar61;
          auVar83._0_4_ = iVar61;
          auVar83._8_4_ = iVar76;
          auVar83._12_4_ = iVar76;
          auVar68._4_4_ = -(uint)(auVar67._4_4_ == iVar60);
          auVar68._12_4_ = -(uint)(auVar67._12_4_ == iVar26);
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar78._0_4_ = auVar78._4_4_;
          auVar78._8_4_ = auVar78._12_4_;
          auVar67 = auVar68 & auVar83 | auVar78;
          auVar67 = packssdw(auVar67,auVar67);
          auVar67 = packssdw(auVar67 ^ _DAT_001370b0,auVar67 ^ _DAT_001370b0);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._0_4_ >> 0x10 & 1) != 0) {
            __ptr_00[uVar3 + 2] = cVar2 + '\x02';
          }
          auVar83 = pshufhw(auVar83,auVar83,0x84);
          auVar69 = pshufhw(auVar68,auVar68,0x84);
          auVar49 = pshufhw(auVar83,auVar78,0x84);
          auVar83 = (auVar49 | auVar69 & auVar83) ^ _DAT_001370b0;
          auVar83 = packssdw(auVar83,auVar83);
          auVar83 = packsswb(auVar83,auVar83);
          if ((auVar83._0_4_ >> 0x18 & 1) != 0) {
            __ptr_00[uVar3 + 3] = cVar2 + '\x03';
          }
          auVar83 = auVar14 ^ auVar84;
          iVar61 = -(uint)(iVar59 < auVar83._0_4_);
          auVar51._4_4_ = -(uint)(iVar60 < auVar83._4_4_);
          iVar76 = -(uint)(iVar25 < auVar83._8_4_);
          auVar51._12_4_ = -(uint)(iVar26 < auVar83._12_4_);
          auVar70._4_4_ = iVar61;
          auVar70._0_4_ = iVar61;
          auVar70._8_4_ = iVar76;
          auVar70._12_4_ = iVar76;
          auVar67 = pshuflw(auVar67,auVar70,0xe8);
          auVar50._4_4_ = -(uint)(auVar83._4_4_ == iVar60);
          auVar50._12_4_ = -(uint)(auVar83._12_4_ == iVar26);
          auVar50._0_4_ = auVar50._4_4_;
          auVar50._8_4_ = auVar50._12_4_;
          auVar37 = pshuflw(auVar46 & auVar37,auVar50,0xe8);
          auVar51._0_4_ = auVar51._4_4_;
          auVar51._8_4_ = auVar51._12_4_;
          auVar83 = pshuflw(auVar67,auVar51,0xe8);
          auVar83 = (auVar83 | auVar37 & auVar67) ^ _DAT_001370b0;
          auVar83 = packssdw(auVar83,auVar83);
          auVar83 = packsswb(auVar83,auVar83);
          if ((auVar83 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            __ptr_00[uVar3 + 4] = cVar2 + '\x04';
          }
          auVar51 = auVar50 & auVar70 | auVar51;
          auVar83 = packssdw(auVar51,auVar51);
          auVar83 = packssdw(auVar83 ^ _DAT_001370b0,auVar83 ^ _DAT_001370b0);
          auVar83 = packsswb(auVar83,auVar83);
          if ((auVar83._4_2_ >> 8 & 1) != 0) {
            __ptr_00[uVar3 + 5] = cVar2 + '\x05';
          }
          auVar83 = auVar15 ^ auVar84;
          iVar61 = -(uint)(iVar59 < auVar83._0_4_);
          auVar79._4_4_ = -(uint)(iVar60 < auVar83._4_4_);
          iVar76 = -(uint)(iVar25 < auVar83._8_4_);
          auVar79._12_4_ = -(uint)(iVar26 < auVar83._12_4_);
          auVar52._4_4_ = iVar61;
          auVar52._0_4_ = iVar61;
          auVar52._8_4_ = iVar76;
          auVar52._12_4_ = iVar76;
          auVar71._4_4_ = -(uint)(auVar83._4_4_ == iVar60);
          auVar71._12_4_ = -(uint)(auVar83._12_4_ == iVar26);
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar79._0_4_ = auVar79._4_4_;
          auVar79._8_4_ = auVar79._12_4_;
          auVar83 = auVar71 & auVar52 | auVar79;
          auVar83 = packssdw(auVar83,auVar83);
          auVar83 = packssdw(auVar83 ^ _DAT_001370b0,auVar83 ^ _DAT_001370b0);
          auVar83 = packsswb(auVar83,auVar83);
          if ((auVar83 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            __ptr_00[uVar3 + 6] = cVar2 + '\x06';
          }
          auVar46 = pshufhw(auVar52,auVar52,0x84);
          auVar69 = pshufhw(auVar71,auVar71,0x84);
          auVar49 = pshufhw(auVar46,auVar79,0x84);
          auVar46 = (auVar49 | auVar69 & auVar46) ^ _DAT_001370b0;
          auVar46 = packssdw(auVar46,auVar46);
          auVar46 = packsswb(auVar46,auVar46);
          if ((auVar46._6_2_ >> 8 & 1) != 0) {
            __ptr_00[uVar3 + 7] = cVar2 + '\a';
          }
          auVar46 = auVar17 ^ auVar84;
          iVar61 = -(uint)(iVar59 < auVar46._0_4_);
          auVar54._4_4_ = -(uint)(iVar60 < auVar46._4_4_);
          iVar76 = -(uint)(iVar25 < auVar46._8_4_);
          auVar54._12_4_ = -(uint)(iVar26 < auVar46._12_4_);
          auVar72._4_4_ = iVar61;
          auVar72._0_4_ = iVar61;
          auVar72._8_4_ = iVar76;
          auVar72._12_4_ = iVar76;
          auVar83 = pshuflw(auVar83,auVar72,0xe8);
          auVar53._4_4_ = -(uint)(auVar46._4_4_ == iVar60);
          auVar53._12_4_ = -(uint)(auVar46._12_4_ == iVar26);
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar46 = pshuflw(auVar37 & auVar67,auVar53,0xe8);
          auVar54._0_4_ = auVar54._4_4_;
          auVar54._8_4_ = auVar54._12_4_;
          auVar37 = pshuflw(auVar83,auVar54,0xe8);
          auVar37 = (auVar37 | auVar46 & auVar83) ^ _DAT_001370b0;
          auVar37 = packssdw(auVar37,auVar37);
          auVar37 = packsswb(auVar37,auVar37);
          if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            __ptr_00[uVar3 + 8] = cVar2 + '\b';
          }
          auVar54 = auVar53 & auVar72 | auVar54;
          auVar37 = packssdw(auVar54,auVar54);
          auVar37 = packssdw(auVar37 ^ _DAT_001370b0,auVar37 ^ _DAT_001370b0);
          auVar37 = packsswb(auVar37,auVar37);
          if ((auVar37._8_2_ >> 8 & 1) != 0) {
            __ptr_00[uVar3 + 9] = cVar2 + '\t';
          }
          auVar37 = auVar19 ^ auVar84;
          iVar61 = -(uint)(iVar59 < auVar37._0_4_);
          auVar80._4_4_ = -(uint)(iVar60 < auVar37._4_4_);
          iVar76 = -(uint)(iVar25 < auVar37._8_4_);
          auVar80._12_4_ = -(uint)(iVar26 < auVar37._12_4_);
          auVar55._4_4_ = iVar61;
          auVar55._0_4_ = iVar61;
          auVar55._8_4_ = iVar76;
          auVar55._12_4_ = iVar76;
          auVar73._4_4_ = -(uint)(auVar37._4_4_ == iVar60);
          auVar73._12_4_ = -(uint)(auVar37._12_4_ == iVar26);
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar80._0_4_ = auVar80._4_4_;
          auVar80._8_4_ = auVar80._12_4_;
          auVar37 = auVar73 & auVar55 | auVar80;
          auVar37 = packssdw(auVar37,auVar37);
          auVar37 = packssdw(auVar37 ^ _DAT_001370b0,auVar37 ^ _DAT_001370b0);
          auVar37 = packsswb(auVar37,auVar37);
          if ((auVar37 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            __ptr_00[uVar3 + 10] = cVar2 + '\n';
          }
          auVar67 = pshufhw(auVar55,auVar55,0x84);
          auVar69 = pshufhw(auVar73,auVar73,0x84);
          auVar49 = pshufhw(auVar67,auVar80,0x84);
          auVar67 = (auVar49 | auVar69 & auVar67) ^ _DAT_001370b0;
          auVar67 = packssdw(auVar67,auVar67);
          auVar67 = packsswb(auVar67,auVar67);
          if ((auVar67._10_2_ >> 8 & 1) != 0) {
            __ptr_00[uVar3 + 0xb] = cVar2 + '\v';
          }
          auVar67 = auVar21 ^ auVar84;
          iVar61 = -(uint)(iVar59 < auVar67._0_4_);
          auVar57._4_4_ = -(uint)(iVar60 < auVar67._4_4_);
          iVar76 = -(uint)(iVar25 < auVar67._8_4_);
          auVar57._12_4_ = -(uint)(iVar26 < auVar67._12_4_);
          auVar74._4_4_ = iVar61;
          auVar74._0_4_ = iVar61;
          auVar74._8_4_ = iVar76;
          auVar74._12_4_ = iVar76;
          auVar37 = pshuflw(auVar37,auVar74,0xe8);
          auVar56._4_4_ = -(uint)(auVar67._4_4_ == iVar60);
          auVar56._12_4_ = -(uint)(auVar67._12_4_ == iVar26);
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar83 = pshuflw(auVar46 & auVar83,auVar56,0xe8);
          auVar83 = auVar83 & auVar37;
          auVar57._0_4_ = auVar57._4_4_;
          auVar57._8_4_ = auVar57._12_4_;
          auVar37 = pshuflw(auVar37,auVar57,0xe8);
          auVar37 = (auVar37 | auVar83) ^ _DAT_001370b0;
          auVar37 = packssdw(auVar37,auVar37);
          auVar37 = packsswb(auVar37,auVar37);
          if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            __ptr_00[uVar3 + 0xc] = cVar2 + '\f';
          }
          auVar57 = auVar56 & auVar74 | auVar57;
          auVar37 = packssdw(auVar57,auVar57);
          auVar37 = packssdw(auVar37 ^ _DAT_001370b0,auVar37 ^ _DAT_001370b0);
          auVar37 = packsswb(auVar37,auVar37);
          if ((auVar37._12_2_ >> 8 & 1) != 0) {
            __ptr_00[uVar3 + 0xd] = cVar2 + '\r';
          }
          auVar37 = auVar24 ^ auVar84;
          auVar81._0_4_ = -(uint)(iVar59 < auVar37._0_4_);
          auVar81._4_4_ = -(uint)(iVar60 < auVar37._4_4_);
          auVar81._8_4_ = -(uint)(iVar25 < auVar37._8_4_);
          auVar81._12_4_ = -(uint)(iVar26 < auVar37._12_4_);
          auVar58._4_4_ = auVar81._0_4_;
          auVar58._0_4_ = auVar81._0_4_;
          auVar58._8_4_ = auVar81._8_4_;
          auVar58._12_4_ = auVar81._8_4_;
          iVar59 = -(uint)(auVar37._4_4_ == iVar60);
          iVar60 = -(uint)(auVar37._12_4_ == iVar26);
          auVar38._4_4_ = iVar59;
          auVar38._0_4_ = iVar59;
          auVar38._8_4_ = iVar60;
          auVar38._12_4_ = iVar60;
          auVar75._4_4_ = auVar81._4_4_;
          auVar75._0_4_ = auVar81._4_4_;
          auVar75._8_4_ = auVar81._12_4_;
          auVar75._12_4_ = auVar81._12_4_;
          in_XMM13 = auVar38 & auVar58 | auVar75;
          auVar37 = packssdw(auVar81,in_XMM13);
          auVar37 = packssdw(auVar37 ^ _DAT_001370b0,auVar37 ^ _DAT_001370b0);
          in_XMM12 = packsswb(auVar37,auVar37);
          if ((in_XMM12 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            __ptr_00[uVar3 + 0xe] = cVar2 + '\x0e';
          }
          auVar46 = pshufhw(auVar58,auVar58,0x84);
          auVar37 = pshufhw(auVar38,auVar38,0x84);
          auVar67 = pshufhw(auVar46,auVar75,0x84);
          auVar37 = packssdw(auVar37 & auVar46,(auVar67 | auVar37 & auVar46) ^ _DAT_001370b0);
          auVar37 = packsswb(auVar37,auVar37);
          if ((auVar37._14_2_ >> 8 & 1) != 0) {
            __ptr_00[uVar3 + 0xf] = cVar2 + '\x0f';
          }
          uVar3 = uVar3 + 0x10;
          lVar7 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 0x10;
          auVar12._8_8_ = lVar7 + 0x10;
          lVar7 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 0x10;
          auVar13._8_8_ = lVar7 + 0x10;
          lVar7 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 0x10;
          auVar14._8_8_ = lVar7 + 0x10;
          lVar7 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 0x10;
          auVar15._8_8_ = lVar7 + 0x10;
          lVar7 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 0x10;
          auVar17._8_8_ = lVar7 + 0x10;
          lVar7 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 0x10;
          auVar19._8_8_ = lVar7 + 0x10;
          lVar7 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 0x10;
          auVar21._8_8_ = lVar7 + 0x10;
          lVar7 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 0x10;
          auVar24._8_8_ = lVar7 + 0x10;
        } while ((uVar9 + 0xf & 0xfffffff0) != uVar3);
        if (*__ptr_00 == '\0') {
          uVar3 = 1;
          do {
            uVar5 = uVar3;
            if (__size == uVar5) break;
            uVar3 = uVar5 + 1;
          } while ((char)((char)(uVar5 + 1) + -1) == __ptr_00[uVar5]);
          local_48.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ =
               CONCAT31(local_48.ss_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._1_3_,__size <= uVar5);
          local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (__size <= uVar5) {
            free(__ptr_00);
            if (uVar9 < 100) goto LAB_001092cc;
            if (uVar9 < 100000) {
              iVar59 = 1;
              do {
                iVar60 = iVar59;
                iVar59 = iVar60 * 2;
              } while (iVar60 < (int)uVar9);
              uVar6 = iVar60 - 1;
              __size = (size_t)uVar6;
              if ((int)uVar6 <= (int)uVar9) {
                __size = (size_t)(iVar60 + (uint)(uVar6 != uVar9));
              }
              goto LAB_001092d2;
            }
            break;
          }
        }
        else {
          local_48.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ =
               (uint)local_48.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._1_3_ << 8;
        }
        local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_70,(internal *)&local_48,
                   (AssertionResult *)"Valid(dst, dst_size)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/realloc_unittest.cc"
                   ,0x62,(char *)local_70);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
        goto LAB_001094d9;
      }
      if (__ptr_00 != (char *)0x0) {
        free(__ptr_00);
      }
LAB_001092cc:
      __size = (size_t)(uVar9 + 1);
LAB_001092d2:
    } while (-1 < (int)__size);
    if (uVar8 < 100) {
      __size_00 = (size_t)(uVar8 + 1);
    }
    else {
      if (99999 < uVar8) break;
      iVar59 = 1;
      do {
        iVar60 = iVar59;
        iVar59 = iVar60 * 2;
      } while (iVar60 < (int)uVar8);
      uVar9 = iVar60 - 1;
      __size_00 = (size_t)uVar9;
      if ((int)uVar9 <= (int)uVar8) {
        __size_00 = (size_t)(iVar60 + (uint)(uVar9 != uVar8));
      }
    }
  } while (-1 < (int)__size_00);
  local_70 = (undefined1  [8])malloc(0x20000);
  (*noopt_helper)(local_70);
  __ptr = local_70;
  lVar7 = 0;
  do {
    pvVar1 = malloc(0x2000);
    *(void **)((long)__ptr + lVar7 * 8) = pvVar1;
    *(int *)((long)pvVar1 + 4000) = (int)lVar7;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x4000);
  lVar7 = 0;
  do {
    local_70 = (undefined1  [8])realloc(*(void **)((long)__ptr + lVar7 * 8),9000);
    (*noopt_helper)(local_70);
    *(undefined1 (*) [8])((long)__ptr + lVar7 * 8) = local_70;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x4000);
  iVar59 = 0;
  lVar7 = 0;
  do {
    iVar59 = iVar59 + *(int *)((long)*(void **)((long)__ptr + lVar7 * 8) + 4000);
    local_50.data_._0_4_ = iVar59;
    free(*(void **)((long)__ptr + lVar7 * 8));
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x4000);
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x7ffe000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_70,"kNumEntries/2 * (kNumEntries - 1)","sum",(int *)&local_48,
             (int *)&local_50);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message(&local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/realloc_unittest.cc"
               ,0x78,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)CONCAT44(local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_48.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_48.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_68;
LAB_00109513:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_68);
    }
  }
  else {
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    free((void *)__ptr);
  }
  return;
}

Assistant:

TEST(ReallocUnittest, Basics) {
  for (int src_size = 0; src_size >= 0; src_size = NextSize(src_size)) {
    for (int dst_size = 0; dst_size >= 0; dst_size = NextSize(dst_size)) {
      unsigned char* src = (unsigned char*) malloc(src_size);
      Fill(src, src_size);
      unsigned char* dst = (unsigned char*) realloc(src, dst_size);
      ASSERT_TRUE(Valid(dst, std::min(src_size, dst_size)));
      Fill(dst, dst_size);
      ASSERT_TRUE(Valid(dst, dst_size));
      if (dst != nullptr) free(dst);
    }
  }

  // Now make sure realloc works correctly even when we overflow the
  // packed cache, so some entries are evicted from the cache.
  // The cache has 2^12 entries, keyed by page number.
  const int kNumEntries = 1 << 14;
  int** p = (int**)noopt(malloc(sizeof(*p) * kNumEntries));
  int sum = 0;
  for (int i = 0; i < kNumEntries; i++) {
    p[i] = (int*)malloc(8192);   // no page size is likely to be bigger
    p[i][1000] = i;              // use memory deep in the heart of p
  }
  for (int i = 0; i < kNumEntries; i++) {
    p[i] = (int*)noopt(realloc(p[i], 9000));
  }
  for (int i = 0; i < kNumEntries; i++) {
    sum += p[i][1000];
    free(p[i]);
  }
  ASSERT_EQ(kNumEntries/2 * (kNumEntries - 1), sum);  // assume kNE is even
  free(p);
}